

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTexture
          (FunctionalTest *this,targetDesc *desc,GLubyte **pixels,GLuint *out_buf_id)

{
  GLenum target;
  GLuint name;
  GLuint level;
  long lVar1;
  GLuint depths [3];
  GLuint widths [3];
  GLuint heights [3];
  
  name = Utils::generateTexture((this->super_TestCase).m_context,desc->m_target);
  target = desc->m_target;
  if ((int)target < 0x9100) {
    if ((target == 0x84f5) || (target == 0x8d41)) {
LAB_0087dc70:
      Utils::prepareTexture
                ((this->super_TestCase).m_context,name,target,desc->m_internal_format,desc->m_format
                 ,desc->m_type,0,desc->m_width,desc->m_height,0xc,*pixels,out_buf_id);
      Utils::makeTextureComplete((this->super_TestCase).m_context,desc->m_target,name,0,0);
      return name;
    }
  }
  else if ((target == 0x9102) || (target == 0x9100)) goto LAB_0087dc70;
  calculateDimmensions
            ((FunctionalTest *)depths,target,desc->m_level,desc->m_width,desc->m_height,widths,
             heights,depths);
  lVar1 = 0;
  do {
    Utils::prepareTexture
              ((this->super_TestCase).m_context,name,desc->m_target,desc->m_internal_format,
               desc->m_format,desc->m_type,(GLuint)lVar1,widths[lVar1],heights[lVar1],depths[lVar1],
               pixels[lVar1],out_buf_id);
    Utils::makeTextureComplete((this->super_TestCase).m_context,desc->m_target,name,0,2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return name;
}

Assistant:

GLuint FunctionalTest::prepareTexture(const targetDesc& desc, const GLubyte** pixels, GLuint& out_buf_id)
{
	GLuint name = Utils::generateTexture(m_context, desc.m_target);

	if (false == Utils::isTargetMultilevel(desc.m_target))
	{
		Utils::prepareTexture(m_context, name, desc.m_target, desc.m_internal_format, desc.m_format, desc.m_type,
							  0 /* level */, desc.m_width, desc.m_height,
							  FUNCTIONAL_TEST_N_LAYERS /* depth - 12 for multilayered, 1D and 2D will ignore that */,
							  pixels[0], out_buf_id);

		Utils::makeTextureComplete(m_context, desc.m_target, name, 0 /* base */, 0 /* max */);
	}
	else
	{
		/* Calculate dimmensions */
		GLuint heights[FUNCTIONAL_TEST_N_LEVELS];
		GLuint widths[FUNCTIONAL_TEST_N_LEVELS];
		GLuint depths[FUNCTIONAL_TEST_N_LEVELS];

		calculateDimmensions(desc.m_target, desc.m_level, desc.m_width, desc.m_height, widths, heights, depths);

		for (GLuint level = 0; level < FUNCTIONAL_TEST_N_LEVELS; ++level)
		{
			Utils::prepareTexture(m_context, name, desc.m_target, desc.m_internal_format, desc.m_format, desc.m_type,
								  level, widths[level], heights[level], depths[level], pixels[level], out_buf_id);

			Utils::makeTextureComplete(m_context, desc.m_target, name, 0 /* base */, 2 /* max */);
		}
	}

	return name;
}